

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  ImVec4 *pIVar6;
  long lVar7;
  ImDrawCmd *pIVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  
  lVar5 = (long)(this->_ClipRectStack).Size;
  pIVar6 = (this->_ClipRectStack).Data + lVar5 + -1;
  if (lVar5 == 0) {
    pIVar6 = &this->_Data->ClipRectFullscreen;
  }
  lVar5._0_4_ = pIVar6->x;
  lVar5._4_4_ = pIVar6->y;
  uVar3 = pIVar6->z;
  uVar4 = pIVar6->w;
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  iVar10 = (this->CmdBuffer).Size;
  iVar1 = (this->CmdBuffer).Capacity;
  if (iVar10 == iVar1) {
    iVar10 = iVar10 + 1;
    if (iVar1 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar1 / 2 + iVar1;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar1 < iVar10) {
      pIVar8 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x30);
      pIVar2 = (this->CmdBuffer).Data;
      if (pIVar2 != (ImDrawCmd *)0x0) {
        memcpy(pIVar8,pIVar2,(long)(this->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar8;
      (this->CmdBuffer).Capacity = iVar10;
    }
  }
  pIVar8 = (this->CmdBuffer).Data;
  iVar10 = (this->CmdBuffer).Size;
  *(ulong *)&pIVar8[iVar10].ClipRect.w = CONCAT44(uStack_24,uVar4);
  pIVar2 = pIVar8 + iVar10;
  pIVar2->ElemCount = (int)(lVar5 << 0x20);
  (pIVar2->ClipRect).x = (float)(int)((ulong)(lVar5 << 0x20) >> 0x20);
  (pIVar2->ClipRect).y = (float)lVar5._4_4_;
  (pIVar2->ClipRect).z = (float)uVar3;
  pIVar8[iVar10].TextureId = pvVar11;
  pIVar8[iVar10].UserCallback = (ImDrawCallback)0x0;
  (&pIVar8[iVar10].UserCallback)[1] = (ImDrawCallback)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}